

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O2

base_uint<256U> * __thiscall base_uint<256U>::operator-=(base_uint<256U> *this,base_uint<256U> *b)

{
  long in_FS_OFFSET;
  base_uint<256U> bStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  operator-(&bStack_38,b);
  operator+=(this,&bStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator-=(const base_uint& b)
    {
        *this += -b;
        return *this;
    }